

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Datetime.cpp
# Opt level: O0

bool __thiscall Datetime::parse_named(Datetime *this,Pig *pig)

{
  bool bVar1;
  size_type previous;
  undefined1 local_60 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokens;
  string token;
  size_type checkpoint;
  Pig *pig_local;
  Datetime *this_local;
  
  previous = Pig::cursor(pig);
  std::__cxx11::string::string
            ((string *)
             &tokens.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_60);
  do {
    bVar1 = Pig::getUntilWS(pig,(string *)
                                &tokens.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (!bVar1) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_60,
                (value_type *)
                &tokens.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    bVar1 = Pig::skipWS(pig);
  } while (bVar1);
  Pig::restoreTo(pig,previous);
  bVar1 = initializeNow(this,pig);
  if (((((bVar1) || (bVar1 = initializeYesterday(this,pig), bVar1)) ||
       (bVar1 = initializeToday(this,pig), bVar1)) ||
      (((((bVar1 = initializeTomorrow(this,pig), bVar1 ||
          (bVar1 = initializeOrdinal(this,pig), bVar1)) ||
         ((bVar1 = initializeDayName(this,pig), bVar1 ||
          ((bVar1 = initializeMonthName(this,pig), bVar1 ||
           (bVar1 = initializeLater(this,pig), bVar1)))))) ||
        (bVar1 = initializeSopd(this,pig), bVar1)) ||
       (((((bVar1 = initializeSod(this,pig), bVar1 || (bVar1 = initializeSond(this,pig), bVar1)) ||
          (bVar1 = initializeEopd(this,pig), bVar1)) ||
         ((bVar1 = initializeEod(this,pig), bVar1 || (bVar1 = initializeEond(this,pig), bVar1)))) ||
        ((bVar1 = initializeSopw(this,pig), bVar1 ||
         ((bVar1 = initializeSow(this,pig), bVar1 || (bVar1 = initializeSonw(this,pig), bVar1)))))))
       ))) || ((((bVar1 = initializeEopw(this,pig), bVar1 ||
                 (((((bVar1 = initializeEow(this,pig), bVar1 ||
                     (bVar1 = initializeEonw(this,pig), bVar1)) ||
                    (bVar1 = initializeSopww(this,pig), bVar1)) ||
                   ((bVar1 = initializeSonww(this,pig), bVar1 ||
                    (bVar1 = initializeSoww(this,pig), bVar1)))) ||
                  (bVar1 = initializeEopww(this,pig), bVar1)))) ||
                (((((bVar1 = initializeEonww(this,pig), bVar1 ||
                    (bVar1 = initializeEoww(this,pig), bVar1)) ||
                   ((bVar1 = initializeSopm(this,pig), bVar1 ||
                    (((bVar1 = initializeSom(this,pig), bVar1 ||
                      (bVar1 = initializeSonm(this,pig), bVar1)) ||
                     (bVar1 = initializeEopm(this,pig), bVar1)))))) ||
                  (((bVar1 = initializeEom(this,pig), bVar1 ||
                    (bVar1 = initializeEonm(this,pig), bVar1)) ||
                   (bVar1 = initializeSopq(this,pig), bVar1)))) ||
                 (((bVar1 = initializeSoq(this,pig), bVar1 ||
                   (bVar1 = initializeSonq(this,pig), bVar1)) ||
                  ((bVar1 = initializeEopq(this,pig), bVar1 ||
                   (((bVar1 = initializeEoq(this,pig), bVar1 ||
                     (bVar1 = initializeEonq(this,pig), bVar1)) ||
                    (bVar1 = initializeSopy(this,pig), bVar1)))))))))) ||
               (((bVar1 = initializeSoy(this,pig), bVar1 ||
                 (bVar1 = initializeSony(this,pig), bVar1)) ||
                ((bVar1 = initializeEopy(this,pig), bVar1 ||
                 (((bVar1 = initializeEoy(this,pig), bVar1 ||
                   (bVar1 = initializeEony(this,pig), bVar1)) ||
                  ((bVar1 = initializeEaster(this,pig), bVar1 ||
                   (((bVar1 = initializeMidsommar(this,pig), bVar1 ||
                     (bVar1 = initializeMidsommarafton(this,pig), bVar1)) ||
                    (bVar1 = initializeInformalTime(this,pig), bVar1)))))))))))))) {
    this_local._7_1_ = true;
  }
  else {
    Pig::restoreTo(pig,previous);
    this_local._7_1_ = false;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_60);
  std::__cxx11::string::~string
            ((string *)
             &tokens.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return this_local._7_1_;
}

Assistant:

bool Datetime::parse_named (Pig& pig)
{
  auto checkpoint = pig.cursor ();

  // Experimental handling of date phrases, such as "first monday in march".
  // Note that this requires that phrases are delimited by EOS or WS.
  std::string token;
  std::vector <std::string> tokens;
  while (pig.getUntilWS (token))
  {
    tokens.push_back (token);
    if (! pig.skipWS ())
      break;
  }

/*
  // This group contains "1st monday ..." which must be processed before
  // initializeOrdinal below.
  if (initializeNthDayInMonth (tokens))
  {
    return true;
  }
*/

  // Restoration necessary because of the tokenization.
  pig.restoreTo (checkpoint);

  if (initializeNow            (pig) ||
      initializeYesterday      (pig) ||
      initializeToday          (pig) ||
      initializeTomorrow       (pig) ||
      initializeOrdinal        (pig) ||
      initializeDayName        (pig) ||
      initializeMonthName      (pig) ||
      initializeLater          (pig) ||
      initializeSopd           (pig) ||
      initializeSod            (pig) ||
      initializeSond           (pig) ||
      initializeEopd           (pig) ||
      initializeEod            (pig) ||
      initializeEond           (pig) ||
      initializeSopw           (pig) ||
      initializeSow            (pig) ||
      initializeSonw           (pig) ||
      initializeEopw           (pig) ||
      initializeEow            (pig) ||
      initializeEonw           (pig) ||
      initializeSopww          (pig) ||  // Must appear after sopw
      initializeSonww          (pig) ||  // Must appear after sonw
      initializeSoww           (pig) ||  // Must appear after sow
      initializeEopww          (pig) ||  // Must appear after eopw
      initializeEonww          (pig) ||  // Must appear after eonw
      initializeEoww           (pig) ||  // Must appear after eow
      initializeSopm           (pig) ||
      initializeSom            (pig) ||
      initializeSonm           (pig) ||
      initializeEopm           (pig) ||
      initializeEom            (pig) ||
      initializeEonm           (pig) ||
      initializeSopq           (pig) ||
      initializeSoq            (pig) ||
      initializeSonq           (pig) ||
      initializeEopq           (pig) ||
      initializeEoq            (pig) ||
      initializeEonq           (pig) ||
      initializeSopy           (pig) ||
      initializeSoy            (pig) ||
      initializeSony           (pig) ||
      initializeEopy           (pig) ||
      initializeEoy            (pig) ||
      initializeEony           (pig) ||
      initializeEaster         (pig) ||
      initializeMidsommar      (pig) ||
      initializeMidsommarafton (pig) ||
      initializeInformalTime   (pig))
  {
    return true;
  }

  pig.restoreTo (checkpoint);
  return false;
}